

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

void write_buf(C_Parser *parser,char *buf,uint64_t val,int sz)

{
  undefined8 in_R8;
  undefined8 in_R9;
  
  switch(sz) {
  case 1:
    *buf = (char)val;
    return;
  case 2:
    *(short *)buf = (short)val;
    return;
  default:
    C_error(parser,"internal error at %s:%d",
            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/chibicc/chibicc_parse.c"
            ,0x587,in_R8,in_R9,&switchD_00126f8e::switchdataD_0013d1c8);
  case 4:
    *(int *)buf = (int)val;
    return;
  case 8:
    *(uint64_t *)buf = val;
    return;
  }
}

Assistant:

static void write_buf(C_Parser *parser, char *buf, uint64_t val, int sz) {
  if (sz == 1)
    *buf = val;
  else if (sz == 2)
    *(uint16_t *)buf = val;
  else if (sz == 4)
    *(uint32_t *)buf = val;
  else if (sz == 8)
    *(uint64_t *)buf = val;
  else
    unreachable(parser);
}